

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

BilinearPatchMesh *
pbrt::BilinearPatch::CreateMesh
          (Transform *renderFromObject,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  PixelFormat PVar1;
  BilinearPatchMesh *pBVar2;
  ulong uVar3;
  long lVar4;
  char *message;
  ulong uVar5;
  pointer args;
  bool bVar6;
  undefined1 auVar7 [16];
  bool reverseOrientation_local;
  vector<int,_std::allocator<int>_> vertexIndices;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  PiecewiseConstant2D *imageDist;
  string filename;
  Allocator alloc_local;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> N;
  Array2D<float> d;
  Tuple2<pbrt::Point2,_float> local_228;
  vector<int,_std::allocator<int>_> faceIndices;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  Bounds2f domain;
  ColorEncodingHandle local_1d0;
  ImageAndMetadata im;
  
  reverseOrientation_local = reverseOrientation;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"indices",(allocator<char> *)&filename);
  ParameterDictionary::GetIntArray(&vertexIndices,parameters,(string *)&im);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string<std::allocator<char>>((string *)&im,"P",(allocator<char> *)&filename)
  ;
  ParameterDictionary::GetPoint3fArray(&P,parameters,(string *)&im);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"uv",(allocator<char> *)&filename);
  ParameterDictionary::GetPoint2fArray(&uv,parameters,(string *)&im);
  std::__cxx11::string::~string((string *)&im);
  if (vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x30) {
      im.image.format = U256;
      im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 1;
      im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 2;
      im.image._12_4_ = 3;
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&vertexIndices,&im);
      goto LAB_00244c55;
    }
    message = "Vertex indices \"indices\" must be provided with bilinear patch mesh shape.";
  }
  else {
    if (((long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start & 0xcU) != 0) {
      PVar1 = (PixelFormat)
              ((ulong)((long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
      im.image.format = PVar1;
      filename._M_dataplus._M_p._0_4_ = PVar1 & (Float|Half);
      Error<int,int>(loc,"Number of vertex indices %d not a multiple of 4. Discarding %d excess.",
                     (int *)&im,(int *)&filename);
      uVar3 = (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      for (; (uVar3 & 0xc) != 0; uVar3 = uVar3 - 4) {
        vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
    }
LAB_00244c55:
    if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
           .super__Vector_impl_data._M_start !=
           uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
           .super__Vector_impl_data._M_finish) &&
         ((long)uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 !=
          ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0xc)) {
        Error(loc,"Number of \"uv\"s for bilinear patch mesh must match \"P\"s. Discarding uvs.");
        std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
        _M_assign_aux<pbrt::Point2<float>const*>
                  ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&uv,0,0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&im,"N",(allocator<char> *)&filename);
      ParameterDictionary::GetNormal3fArray(&N,parameters,(string *)&im);
      std::__cxx11::string::~string((string *)&im);
      if ((N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        Error(loc,"Number of \"N\"s for bilinear patch mesh must match \"P\"s. Discarding \"N\"s.");
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::operator=
                  (&N,(initializer_list<pbrt::Normal3<float>_>)ZEXT816(0));
      }
      uVar3 = ((long)P.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      lVar4 = (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      args = vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
      while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
        if (uVar3 <= (ulong)(long)*args) {
          im.image.format = (PixelFormat)uVar3;
          Error<int&,int>(loc,
                          "Bilinear patch mesh has out of-bounds vertex index %d (%d \"P\" values were given. Discarding this mesh."
                          ,args,(int *)&im);
          pBVar2 = (BilinearPatchMesh *)0x0;
          goto LAB_00244fca;
        }
        args = args + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&im,"faceIndices",(allocator<char> *)&filename);
      ParameterDictionary::GetIntArray(&faceIndices,parameters,(string *)&im);
      std::__cxx11::string::~string((string *)&im);
      if (faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar3 = (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar5 = (ulong)((long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)vertexIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) >> 2;
        if (uVar3 != uVar5) {
          im.image.format = (PixelFormat)uVar3;
          filename._M_dataplus._M_p._0_4_ = (PixelFormat)uVar5;
          Error<int,int>(loc,
                         "Number of face indices %d does not match number of bilinear patches %d. Discarding face indices."
                         ,(int *)&im,(int *)&filename);
          std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                    ((vector<int,std::allocator<int>> *)&faceIndices,0,0);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&d,"emissionfilename",(allocator<char> *)&imageDist);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&domain,"",(allocator<char> *)&local_228);
      ParameterDictionary::GetOneString((string *)&im,parameters,(string *)&d,(string *)&domain);
      ResolveFilename(&filename,(string *)&im);
      std::__cxx11::string::~string((string *)&im);
      std::__cxx11::string::~string((string *)&domain);
      std::__cxx11::string::~string((string *)&d);
      imageDist = (PiecewiseConstant2D *)0x0;
      if (filename._M_string_length != 0) {
        local_1d0.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        Image::Read(&im,&filename,alloc,&local_1d0);
        auVar7._8_4_ = 0x3f800000;
        auVar7._0_8_ = 0x3f8000003f800000;
        auVar7._12_4_ = 0x3f800000;
        d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
        d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
        local_228 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7);
        Bounds2<float>::Bounds2(&domain,(Point2<float> *)&d,(Point2<float> *)&local_228);
        Image::GetSamplingDistribution(&d,&im.image);
        imageDist = pstd::pmr::polymorphic_allocator<std::byte>::
                    new_object<pbrt::PiecewiseConstant2D,pbrt::Array2D<float>&,pbrt::Bounds2<float>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                              (&alloc_local,&d,&domain,&alloc_local);
        Array2D<float>::~Array2D(&d);
        ImageAndMetadata::~ImageAndMetadata(&im);
      }
      pBVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::BilinearPatchMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>,pbrt::PiecewiseConstant2D*&>
                         (&alloc_local,renderFromObject,&reverseOrientation_local,&vertexIndices,&P,
                          &N,&uv,&faceIndices,&imageDist);
      std::__cxx11::string::~string((string *)&filename);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&faceIndices.super__Vector_base<int,_std::allocator<int>_>);
LAB_00244fca:
      std::_Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~_Vector_base
                (&N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                );
      goto LAB_00244fe7;
    }
    message = "Vertex positions \"P\" must be provided with bilinear patch mesh shape.";
  }
  Error(loc,message);
  pBVar2 = (BilinearPatchMesh *)0x0;
LAB_00244fe7:
  std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
            (&uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>);
  std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
            (&P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vertexIndices.super__Vector_base<int,_std::allocator<int>_>);
  return pBVar2;
}

Assistant:

BilinearPatchMesh *BilinearPatch::CreateMesh(const Transform *renderFromObject,
                                             bool reverseOrientation,
                                             const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    std::vector<int> vertexIndices = parameters.GetIntArray("indices");
    std::vector<Point3f> P = parameters.GetPoint3fArray("P");
    std::vector<Point2f> uv = parameters.GetPoint2fArray("uv");

    if (vertexIndices.empty()) {
        if (P.size() == 4)
            // single patch
            vertexIndices = {0, 1, 2, 3};
        else {
            Error(loc, "Vertex indices \"indices\" must be provided with "
                       "bilinear patch mesh shape.");
            return {};
        }
    } else if ((vertexIndices.size() % 4) != 0u) {
        Error(loc,
              "Number of vertex indices %d not a multiple of 4. Discarding %d "
              "excess.",
              int(vertexIndices.size()), int(vertexIndices.size() % 4));
        while ((vertexIndices.size() % 4) != 0u)
            vertexIndices.pop_back();
    }

    if (P.empty()) {
        Error(loc, "Vertex positions \"P\" must be provided with bilinear "
                   "patch mesh shape.");
        return {};
    }

    if (!uv.empty() && uv.size() != P.size()) {
        Error(loc, "Number of \"uv\"s for bilinear patch mesh must match \"P\"s. "
                   "Discarding uvs.");
        uv = {};
    }

    std::vector<Normal3f> N = parameters.GetNormal3fArray("N");
    if (!N.empty() && N.size() != P.size()) {
        Error(loc, "Number of \"N\"s for bilinear patch mesh must match \"P\"s. "
                   "Discarding \"N\"s.");
        N = {};
    }

    for (size_t i = 0; i < vertexIndices.size(); ++i)
        if (vertexIndices[i] >= P.size()) {
            Error(loc,
                  "Bilinear patch mesh has out of-bounds vertex index %d (%d "
                  "\"P\" "
                  "values were given. Discarding this mesh.",
                  vertexIndices[i], (int)P.size());
            return {};
        }

    std::vector<int> faceIndices = parameters.GetIntArray("faceIndices");
    if (!faceIndices.empty() && faceIndices.size() != vertexIndices.size() / 4) {
        Error(loc,
              "Number of face indices %d does not match number of bilinear "
              "patches %d. "
              "Discarding face indices.",
              int(faceIndices.size()), int(vertexIndices.size() / 4));
        faceIndices = {};
    }

    // Grab this before the vertexIndices are std::moved...
    size_t nBlps = vertexIndices.size() / 4;

    std::string filename =
        ResolveFilename(parameters.GetOneString("emissionfilename", ""));
    PiecewiseConstant2D *imageDist = nullptr;
    if (!filename.empty()) {
        ImageAndMetadata im = Image::Read(filename, alloc);
        Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
        Array2D<Float> d = im.image.GetSamplingDistribution();
        imageDist = alloc.new_object<PiecewiseConstant2D>(d, domain, alloc);
    }

    return alloc.new_object<BilinearPatchMesh>(
        *renderFromObject, reverseOrientation, std::move(vertexIndices), std::move(P),
        std::move(N), std::move(uv), std::move(faceIndices), imageDist);
}